

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

void __thiscall
icu_63::TimeZoneNamesImpl::addAllNamesIntoTrie(TimeZoneNamesImpl *this,UErrorCode *status)

{
  UBool UVar1;
  UHashElement *pUVar2;
  ZNames *znames_1;
  UChar *tzID;
  ZNames *znames;
  UChar *mzID;
  UHashElement *element;
  UErrorCode *pUStack_18;
  int32_t pos;
  UErrorCode *status_local;
  TimeZoneNamesImpl *this_local;
  
  pUStack_18 = status;
  status_local = (UErrorCode *)this;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 != '\0') {
    return;
  }
  element._4_4_ = 0xffffffff;
  do {
    do {
      pUVar2 = uhash_nextElement_63(this->fMZNamesMap,(int32_t *)((long)&element + 4));
      if (pUVar2 == (UHashElement *)0x0) {
        element._4_4_ = 0xffffffff;
        do {
          do {
            pUVar2 = uhash_nextElement_63(this->fTZNamesMap,(int32_t *)((long)&element + 4));
            if (pUVar2 == (UHashElement *)0x0) {
              return;
            }
          } while ((char *)(pUVar2->value).pointer == "<empty>");
          ZNames::addAsTimeZoneIntoTrie
                    ((ZNames *)(pUVar2->value).pointer,(UChar *)(pUVar2->key).pointer,
                     &this->fNamesTrie,pUStack_18);
          UVar1 = ::U_FAILURE(*pUStack_18);
        } while (UVar1 == '\0');
        return;
      }
    } while ((char *)(pUVar2->value).pointer == "<empty>");
    ZNames::addAsMetaZoneIntoTrie
              ((ZNames *)(pUVar2->value).pointer,(UChar *)(pUVar2->key).pointer,&this->fNamesTrie,
               pUStack_18);
    UVar1 = ::U_FAILURE(*pUStack_18);
  } while (UVar1 == '\0');
  return;
}

Assistant:

void TimeZoneNamesImpl::addAllNamesIntoTrie(UErrorCode& status) {
    if (U_FAILURE(status)) return;
    int32_t pos;
    const UHashElement* element;

    pos = UHASH_FIRST;
    while ((element = uhash_nextElement(fMZNamesMap, &pos)) != NULL) {
        if (element->value.pointer == EMPTY) { continue; }
        UChar* mzID = (UChar*) element->key.pointer;
        ZNames* znames = (ZNames*) element->value.pointer;
        znames->addAsMetaZoneIntoTrie(mzID, fNamesTrie, status);
        if (U_FAILURE(status)) { return; }
    }

    pos = UHASH_FIRST;
    while ((element = uhash_nextElement(fTZNamesMap, &pos)) != NULL) {
        if (element->value.pointer == EMPTY) { continue; }
        UChar* tzID = (UChar*) element->key.pointer;
        ZNames* znames = (ZNames*) element->value.pointer;
        znames->addAsTimeZoneIntoTrie(tzID, fNamesTrie, status);
        if (U_FAILURE(status)) { return; }
    }
}